

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O0

string * __thiscall
verilogAST::Always::toString_abi_cxx11_(string *__return_storage_ptr__,Always *this)

{
  bool bVar1;
  pointer pBVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  reference local_108;
  unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>
  *statement;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
  *__range1_1;
  string local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  string local_a8;
  string local_88;
  reference local_68;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>
  *it;
  iterator __end1;
  iterator __begin1;
  vector<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sensitivity_strs;
  allocator<char> local_1a;
  byte local_19;
  Always *local_18;
  Always *this_local;
  string *always_str;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Always *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"always @(");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  __end1 = std::
           vector<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>_>_>
           ::begin(&this->sensitivity_list);
  it = (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>
        *)std::
          vector<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>_>_>
          ::end(&this->sensitivity_list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>_*,_std::vector<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>_>_>_>
                                *)&it);
    if (!bVar1) break;
    local_68 = __gnu_cxx::
               __normal_iterator<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>_*,_std::vector<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>_>_>_>
               ::operator*(&__end1);
    variant_to_string<std::unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>>,std::unique_ptr<verilogAST::PosEdge,std::default_delete<verilogAST::PosEdge>>,std::unique_ptr<verilogAST::NegEdge,std::default_delete<verilogAST::NegEdge>>,std::unique_ptr<verilogAST::Star,std::default_delete<verilogAST::Star>>>
              (&local_88,local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    __gnu_cxx::
    __normal_iterator<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>_*,_std::vector<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,", ",(allocator<char> *)((long)&__range1_1 + 7));
  join(&local_a8,&local_c0,&local_e0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,") begin\n");
  __end1_1 = std::
             vector<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
             ::begin(&this->body);
  statement = (unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>
               *)std::
                 vector<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
                 ::end(&this->body);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_*,_std::vector<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>_>
                        *)&statement);
    if (!bVar1) break;
    local_108 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_*,_std::vector<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>_>
                ::operator*(&__end1_1);
    pBVar2 = std::
             unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>
             ::operator->(local_108);
    (*(code *)**(undefined8 **)pBVar2)(&local_148);
    std::operator+(&local_128,&local_148,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_*,_std::vector<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"end\n");
  local_19 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Always::toString() {
  std::string always_str = "";
  always_str += "always @(";

  // emit sensitivity string
  std::vector<std::string> sensitivity_strs;
  for (auto &it : sensitivity_list) {
    sensitivity_strs.push_back(variant_to_string(it));
  }
  always_str += join(sensitivity_strs, ", ");
  always_str += ") begin\n";

  // emit body
  for (auto &statement : body) {
    always_str += statement->toString() + "\n";
  }

  always_str += "end\n";
  return always_str;
}